

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.hpp
# Opt level: O1

void __thiscall
quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
::find_adjacent_facets
          (quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
           *this,facet *_facet,size_type f,size_type _skip)

{
  unordered_set<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge_hash,_std::equal_to<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>_>
  *this_00;
  pointer p_Var1;
  pointer puVar2;
  const_iterator __it;
  size_type sVar3;
  ulong uVar4;
  _Fwd_list_node_base *p_Var5;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_true,_false>,_bool>
  pVar6;
  _Hashtable<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_std::__detail::_Identity,_std::equal_to<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_58;
  facet *local_50;
  size_type local_48;
  size_type local_40;
  ulong local_38;
  
  if (this->dimension_ == 0) {
    uVar4 = 0;
  }
  else {
    p_Var1 = (_facet->vertices_).
             super__Vector_base<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->vertices_hashes_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    sVar3 = 0;
    do {
      if (_skip != sVar3) {
        p_Var5 = p_Var1[sVar3]._M_node + 1;
        puVar2[sVar3] = (unsigned_long)p_Var5;
        uVar4 = uVar4 ^ (ulong)p_Var5;
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 < this->dimension_);
  }
  if (this->dimension_ != 0) {
    this_00 = &this->unique_ridges_;
    sVar3 = 0;
    do {
      if (_skip != sVar3) {
        local_38 = (this->vertices_hashes_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar3] ^ uVar4;
        local_58 = &this_00->_M_h;
        local_50 = _facet;
        local_48 = f;
        local_40 = sVar3;
        pVar6 = std::
                _Hashtable<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge,quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge,std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge>,std::__detail::_Identity,std::equal_to<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge>,quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge,false>>>>
                          ((_Hashtable<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge,quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge,std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge>,std::__detail::_Identity,std::equal_to<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge>,quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::ridge_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)this_00,&local_50,&local_58);
        __it.
        super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
        ._M_cur = (_Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
                   )pVar6.first.
                    super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
                    ._M_cur;
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          *(size_type *)
           (*(long *)(*(long *)((long)__it.
                                      super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
                                      ._M_cur + 8) + 0x18) +
           *(long *)((long)__it.
                           super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
                           ._M_cur + 0x18) * 8) = f;
          (_facet->neighbours_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[sVar3] =
               *(unsigned_long *)
                ((long)__it.
                       super__Node_iterator_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_false>
                       ._M_cur + 0x10);
          std::
          _Hashtable<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_std::__detail::_Identity,_std::equal_to<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge>,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::ridge_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::erase(&this_00->_M_h,__it);
        }
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 < this->dimension_);
  }
  return;
}

Assistant:

void
    find_adjacent_facets(facet & _facet,
                         size_type const f,
                         size_type const _skip)
    {
        size_type ridge_hash_ = 0;
        for (size_type v = 0; v < dimension_; ++v) {
            if (v != _skip) {
                ridge_hash_ ^= (vertices_hashes_[v] = point_hash_(std::addressof(*_facet.vertices_[v])));
            }
        }
        for (size_type v = 0; v < dimension_; ++v) {
            if (v != _skip) { // neighbouring facet against apex (_skip-indexed) is known atm
                auto const position = unique_ridges_.insert({_facet, f, v, (ridge_hash_ ^ vertices_hashes_[v])});
                if (!position.second) {
                    ridge const & ridge_ = *position.first;
                    ridge_.facet_.neighbours_[ridge_.v] = f;
                    _facet.neighbours_[v] = ridge_.f;
                    unique_ridges_.erase(position.first);
                }
            }
        }
    }